

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

Instr * __thiscall LowererMDArch::LowerExitInstr(LowererMDArch *this,ExitInstr *exitInstr)

{
  code *pcVar1;
  bool bVar2;
  RegNum reg_00;
  byte bVar3;
  BOOL BVar4;
  int iVar5;
  Which WVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  IndirOpnd *src1Opnd;
  Instr *pIVar10;
  IntConstOpnd *pIVar11;
  Instr *pIVar12;
  JITTimeFunctionBody *pJVar13;
  AsmJsJITInfo *this_00;
  Func *pFVar14;
  IRType IVar15;
  RegNum reg;
  ulong uVar16;
  int local_34;
  
  pIVar12 = (exitInstr->super_Instr).m_prev;
  if (pIVar12 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x80a,"(exitPrevInstr)",
                       "Can a function have only 1 instr ? Or is the instr chain broken");
    if (!bVar2) goto LAB_0064f9dc;
    *puVar7 = 0;
  }
  iVar5 = 0;
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  uVar16 = 1;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_34 = 0;
  do {
    bVar2 = LinearScan::IsCalleeSaved((RegNum)uVar16);
    if ((bVar2) &&
       ((BVar4 = Func::HasTry(this->m_func), BVar4 != 0 ||
        (pFVar14 = this->m_func, BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar16),
        ((pFVar14->m_regsUsed).word >> (uVar16 & 0x3f) & 1) != 0)))) {
      IVar15 = RegTypes[uVar16];
      pRVar9 = IR::RegOpnd::New((StackSym *)0x0,(RegNum)uVar16,IVar15,this->m_func);
      if (IVar15 != TyInt64) {
        if (IVar15 == TyFloat64) {
          src1Opnd = IR::IndirOpnd::New(pRVar8,local_34,TyFloat64,this->m_func,false);
          pIVar10 = IR::Instr::New(MOVAPS,&pRVar9->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
          local_34 = local_34 + 0x10;
          IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar10);
          goto LAB_0064f3cd;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x825,"(type == TyInt64)","type == TyInt64");
        if (!bVar2) goto LAB_0064f9dc;
        *puVar7 = 0;
      }
      pIVar10 = IR::Instr::New(POP,&pRVar9->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar10);
      iVar5 = iVar5 + 8;
    }
LAB_0064f3cd:
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x21);
  if (iVar5 != this->m_func->m_savedRegSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x82f,"(savedRegSize == (uint)this->m_func->GetSavedRegSize())",
                       "savedRegSize == (uint)this->m_func->GetSavedRegSize()");
    if (!bVar2) goto LAB_0064f9dc;
    *puVar7 = 0;
  }
  uVar16 = (ulong)(uint)this->m_func->m_argsSize;
  if (uVar16 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x834,"(stackArgsSize)","stackArgsSize");
    if (!bVar2) goto LAB_0064f9dc;
    *puVar7 = 0;
  }
  if (iVar5 != 0 || local_34 != 0) {
    pIVar11 = IR::IntConstOpnd::New(uVar16,TyInt64,this->m_func,false);
    pIVar10 = IR::Instr::New(ADD,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pIVar11->super_Opnd,
                             this->m_func);
    IR::Instr::InsertAfter(pIVar12,pIVar10);
  }
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  pRVar9 = IR::RegOpnd::New((StackSym *)0x0,RegRBP,TyInt64,this->m_func);
  pIVar12 = IR::Instr::New(MOV,&pRVar8->super_Opnd,&pRVar9->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar12);
  pIVar12 = IR::Instr::New(POP,&pRVar9->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar12);
  pIVar11 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar13);
  if ((!bVar2) || (bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem), bVar2)) {
switchD_0064f805_caseD_1:
    bVar2 = IRType_IsFloat(TyInt64);
    reg_00 = RegXMM0;
    if (!bVar2) {
      bVar2 = IRType_IsSimd128(TyInt64);
      reg_00 = bVar2 * '\x10' + RegRAX;
    }
    pFVar14 = this->m_func;
    IVar15 = TyInt64;
    goto LAB_0064f5c5;
  }
  pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar13);
  WVar6 = AsmJsJITInfo::GetRetType(this_00);
  switch(WVar6) {
  case Int64:
  case Signed:
    goto switchD_0064f805_caseD_1;
  case Double:
  case Float:
    bVar2 = IRType_IsFloat(TyFloat64);
    reg_00 = RegXMM0;
    if (!bVar2) {
      bVar2 = IRType_IsSimd128(TyFloat64);
      reg_00 = bVar2 * '\x10' + RegRAX;
    }
    pFVar14 = this->m_func;
    IVar15 = TyFloat64;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x886,"((0))","(0)");
    if (!bVar2) goto LAB_0064f9dc;
    *puVar7 = 0;
  case Void:
    pRVar8 = (RegOpnd *)0x0;
    goto LAB_0064f5cd;
  case Int32x4:
    reg_00 = GetRegReturnAsmJs(TySimd128I4);
    pFVar14 = this->m_func;
    IVar15 = TySimd128I4;
    break;
  case Uint32x4:
    reg_00 = GetRegReturnAsmJs(TySimd128U4);
    pFVar14 = this->m_func;
    IVar15 = TySimd128U4;
    break;
  case Int16x8:
    reg_00 = GetRegReturnAsmJs(TySimd128I8);
    pFVar14 = this->m_func;
    IVar15 = TySimd128I8;
    break;
  case Int8x16:
    IVar15 = TySimd128I16;
    goto LAB_0064f98a;
  case Uint16x8:
    reg_00 = GetRegReturnAsmJs(TySimd128U8);
    pFVar14 = this->m_func;
    IVar15 = TySimd128U8;
    break;
  case Uint8x16:
    IVar15 = TySimd128U16;
LAB_0064f98a:
    reg_00 = GetRegReturnAsmJs(IVar15);
    pFVar14 = this->m_func;
    IVar15 = TySimd128U16;
    break;
  case Bool32x4:
    reg_00 = GetRegReturnAsmJs(TySimd128B4);
    pFVar14 = this->m_func;
    IVar15 = TySimd128B4;
    break;
  case Bool16x8:
    reg_00 = GetRegReturnAsmJs(TySimd128B8);
    pFVar14 = this->m_func;
    IVar15 = TySimd128B8;
    break;
  case Bool8x16:
    reg_00 = GetRegReturnAsmJs(TySimd128B16);
    pFVar14 = this->m_func;
    IVar15 = TySimd128B16;
    break;
  case Float32x4:
    reg_00 = GetRegReturnAsmJs(TySimd128F4);
    pFVar14 = this->m_func;
    IVar15 = TySimd128F4;
    break;
  case Float64x2:
    reg_00 = GetRegReturnAsmJs(TySimd128D2);
    pFVar14 = this->m_func;
    IVar15 = TySimd128D2;
    break;
  case Int64x2:
    reg_00 = GetRegReturnAsmJs(TySimd128I2);
    pFVar14 = this->m_func;
    IVar15 = TySimd128I2;
  }
LAB_0064f5c5:
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,reg_00,IVar15,pFVar14);
LAB_0064f5cd:
  pIVar12 = IR::Instr::New(RET,this->m_func);
  if (pIVar12->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_0064f9dc;
    *puVar7 = 0;
  }
  pFVar14 = pIVar12->m_func;
  if ((pIVar11->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) goto LAB_0064f9dc;
    *puVar7 = 0;
  }
  bVar3 = (pIVar11->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    pIVar11 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar11->super_Opnd,pFVar14);
    bVar3 = (pIVar11->super_Opnd).field_0xb;
  }
  (pIVar11->super_Opnd).field_0xb = bVar3 | 2;
  pIVar12->m_src1 = &pIVar11->super_Opnd;
  if (pRVar8 != (RegOpnd *)0x0) {
    if (pIVar12->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar2) goto LAB_0064f9dc;
      *puVar7 = 0;
    }
    pFVar14 = pIVar12->m_func;
    if ((pRVar8->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar2) {
LAB_0064f9dc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    bVar3 = (pRVar8->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,pFVar14);
      bVar3 = (pRVar8->super_Opnd).field_0xb;
    }
    (pRVar8->super_Opnd).field_0xb = bVar3 | 2;
    pIVar12->m_src2 = &pRVar8->super_Opnd;
  }
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar12);
  pIVar12->m_opcode = RET;
  return &exitInstr->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerExitInstr(IR::ExitInstr * exitInstr)
{
    uint32 savedRegSize = 0;

    // POP used callee-saved registers

    IR::Instr * exitPrevInstr = exitInstr->m_prev;
    AssertMsg(exitPrevInstr, "Can a function have only 1 instr ? Or is the instr chain broken");

    IR::RegOpnd *stackPointer = IR::RegOpnd::New(nullptr, GetRegStackPointer(), TyMachReg, this->m_func);

    unsigned xmmOffset = 0;

    for (RegNum reg = (RegNum)(RegNOREG + 1); reg < RegNumCount; reg = (RegNum)(reg+1))
    {
        if (LinearScan::IsCalleeSaved(reg) && (this->m_func->HasTry() || this->m_func->m_regsUsed.Test(reg)))
        {
            IRType       type    = RegTypes[reg];
            IR::RegOpnd *regOpnd = IR::RegOpnd::New(nullptr, reg, type, this->m_func);

            if (type == TyFloat64)
            {
                IR::Instr *restoreInstr = IR::Instr::New(Js::OpCode::MOVAPS,
                                                         regOpnd,
                                                         IR::IndirOpnd::New(stackPointer,
                                                                            xmmOffset,
                                                                            type,
                                                                            this->m_func),
                                                         this->m_func);
                xmmOffset += (MachDouble * 2);
                exitInstr->InsertBefore(restoreInstr);
            }
            else
            {
                Assert(type == TyInt64);

                IR::Instr *popInstr = IR::Instr::New(Js::OpCode::POP, regOpnd, this->m_func);
                exitInstr->InsertBefore(popInstr);

                savedRegSize += MachPtr;
            }
        }
    }

    Assert(savedRegSize == (uint)this->m_func->GetSavedRegSize());


    // Generate ADD RSP, argsStackSize before the register restore (if there are any)
    uint32 stackArgsSize = this->m_func->GetArgsSize();
    Assert(stackArgsSize);
    if (savedRegSize || xmmOffset)
    {
        IR::IntConstOpnd *stackSizeOpnd = IR::IntConstOpnd::New(stackArgsSize, TyMachReg, this->m_func);
        IR::Instr *addInstr = IR::Instr::New(Js::OpCode::ADD, stackPointer, stackPointer, stackSizeOpnd, this->m_func);
        exitPrevInstr->InsertAfter(addInstr);
    }

    //
    // useful register operands
    //
    IR::RegOpnd * rspOpnd = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);
    IR::RegOpnd * rbpOpnd = IR::RegOpnd::New(nullptr, RegRBP, TyMachReg, this->m_func);

    // Restore frame

    // Generate MOV RSP, RBP

    IR::Instr * movInstr = IR::Instr::New(Js::OpCode::MOV, rspOpnd, rbpOpnd, this->m_func);
    exitInstr->InsertBefore(movInstr);

    // Generate POP RBP

    IR::Instr * pushInstr = IR::Instr::New(Js::OpCode::POP, rbpOpnd, this->m_func);
    exitInstr->InsertBefore(pushInstr);

    // Insert RET
    IR::IntConstOpnd * intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    IR::RegOpnd *retReg = nullptr;
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody())
    {
        switch (m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetRetType())
        {
        case Js::AsmJsRetType::Double:
        case Js::AsmJsRetType::Float:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TyMachDouble), TyMachDouble, this->m_func);
            break;
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Int32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I4), TySimd128I4, this->m_func);
            break;
        case Js::AsmJsRetType::Int16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I8), TySimd128I8, this->m_func);
            break;
        case Js::AsmJsRetType::Int8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I16), TySimd128U16, this->m_func);
            break;
        case Js::AsmJsRetType::Uint32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U4), TySimd128U4, this->m_func);
            break;
        case Js::AsmJsRetType::Uint16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U8), TySimd128U8, this->m_func);
            break;
        case Js::AsmJsRetType::Uint8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U16), TySimd128U16, this->m_func);
            break;
        case Js::AsmJsRetType::Bool32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B4), TySimd128B4, this->m_func);
            break;
        case Js::AsmJsRetType::Bool16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B8), TySimd128B8, this->m_func);
            break;
        case Js::AsmJsRetType::Bool8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B16), TySimd128B16, this->m_func);
            break;
        case Js::AsmJsRetType::Float32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128F4), TySimd128F4, this->m_func);
            break;
        case Js::AsmJsRetType::Float64x2:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128D2), TySimd128D2, this->m_func);
            break;
        case Js::AsmJsRetType::Int64x2:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I2), TySimd128I2, this->m_func);
            break;
#endif
        case Js::AsmJsRetType::Int64:
        case Js::AsmJsRetType::Signed:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturn(TyMachReg), TyMachReg, this->m_func);
            break;
        case Js::AsmJsRetType::Void:
            break;
        default:
            Assume(UNREACHED);
        }
    }
    else
    {
        retReg = IR::RegOpnd::New(nullptr, this->GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    }


    // Generate RET
    IR::Instr * retInstr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    retInstr->SetSrc1(intSrc);
    if (retReg)
    {
        retInstr->SetSrc2(retReg);
    }
    exitInstr->InsertBefore(retInstr);

    retInstr->m_opcode = Js::OpCode::RET;


    return exitInstr;
}